

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void __thiscall
FFont::BuildTranslations
          (FFont *this,double *luminosity,BYTE *identity,void *ranges,int total_colors,
          PalEntry *palette)

{
  TArray<FRemapTable,_FRemapTable> *this_00;
  short *psVar1;
  short *psVar2;
  short sVar3;
  BYTE BVar4;
  short *psVar5;
  long lVar6;
  int iVar7;
  uint r;
  uint b;
  int iVar8;
  int iVar9;
  uint g;
  short *local_78;
  FRemapTable remap;
  
  FRemapTable::FRemapTable(&remap,total_colors);
  this_00 = &this->Ranges;
  TArray<FRemapTable,_FRemapTable>::Clear(this_00);
  iVar9 = 0;
  local_78 = (short *)ranges;
  do {
    if (NumTextColors <= iVar9) {
      FRemapTable::~FRemapTable(&remap);
      return;
    }
    if (iVar9 == 0xb) {
      if (identity == (BYTE *)0x0) {
        FRemapTable::operator=(&remap,this_00->Array);
      }
      else {
        memcpy(remap.Remap,identity,(long)this->ActiveColors);
        if (palette == (PalEntry *)0x0) {
          ((remap.Palette)->field_0).d = GPalette.BaseColors[*identity].field_0.d & 0xffffff;
          for (lVar6 = 1; lVar6 < this->ActiveColors; lVar6 = lVar6 + 1) {
            remap.Palette[lVar6].field_0 =
                 (anon_union_4_2_12391d7c_for_PalEntry_0)
                 (GPalette.BaseColors[identity[lVar6]].field_0.d | 0xff000000);
          }
        }
        else {
          memcpy(remap.Palette,palette,(long)this->ActiveColors << 2);
        }
      }
      TArray<FRemapTable,_FRemapTable>::Push(this_00,&remap);
    }
    else {
      if (*local_78 < 0) {
        __assert_fail("parmstart->RangeStart >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_font.cpp"
                      ,0x2b8,
                      "void FFont::BuildTranslations(const double *, const BYTE *, const void *, int, const PalEntry *)"
                     );
      }
      *remap.Remap = '\0';
      ((remap.Palette)->field_0).d = 0;
      for (lVar6 = 1; lVar6 < this->ActiveColors; lVar6 = lVar6 + 1) {
        iVar8 = (int)(luminosity[lVar6] * 256.0);
        psVar5 = local_78;
        do {
          psVar1 = psVar5;
          iVar7 = (int)*psVar1;
          sVar3 = psVar1[1];
          if ((iVar7 <= iVar8) && (iVar8 <= sVar3)) break;
          psVar5 = psVar1 + 5;
        } while (sVar3 < psVar1[5]);
        iVar8 = ((iVar8 - iVar7) * 0x100) / (sVar3 - iVar7);
        r = (int)(((uint)*(byte *)((long)psVar1 + 7) - (uint)*(byte *)(psVar1 + 2)) * iVar8 +
                 (uint)*(byte *)(psVar1 + 2) * 0x100) >> 8;
        g = (int)(((uint)*(byte *)(psVar1 + 4) - (uint)*(byte *)((long)psVar1 + 5)) * iVar8 +
                 (uint)*(byte *)((long)psVar1 + 5) * 0x100) >> 8;
        b = (int)(((uint)*(byte *)((long)psVar1 + 9) - (uint)*(byte *)(psVar1 + 3)) * iVar8 +
                 (uint)*(byte *)(psVar1 + 3) * 0x100) >> 8;
        if (0xfe < (int)r) {
          r = 0xff;
        }
        if ((int)r < 1) {
          r = 0;
        }
        if (0xfe < (int)g) {
          g = 0xff;
        }
        if ((int)g < 1) {
          g = 0;
        }
        if (0xfe < (int)b) {
          b = 0xff;
        }
        if ((int)b < 1) {
          b = 0;
        }
        BVar4 = FColorMatcher::Pick(&ColorMatcher,r,g,b);
        remap.Remap[lVar6] = BVar4;
        remap.Palette[lVar6].field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)((g & 0xff) << 8 | r << 0x10 | b | 0xff000000);
      }
      TArray<FRemapTable,_FRemapTable>::Push(this_00,&remap);
      psVar5 = local_78;
      do {
        local_78 = psVar5 + 5;
        psVar1 = psVar5 + 5;
        psVar2 = psVar5 + 1;
        psVar5 = local_78;
      } while (*psVar2 < *psVar1);
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

void FFont::BuildTranslations (const double *luminosity, const BYTE *identity,
							   const void *ranges, int total_colors, const PalEntry *palette)
{
	int i, j;
	const TranslationParm *parmstart = (const TranslationParm *)ranges;

	FRemapTable remap(total_colors);

	// Create different translations for different color ranges
	Ranges.Clear();
	for (i = 0; i < NumTextColors; i++)
	{
		if (i == CR_UNTRANSLATED)
		{
			if (identity != NULL)
			{
				memcpy (remap.Remap, identity, ActiveColors);
				if (palette != NULL)
				{
					memcpy (remap.Palette, palette, ActiveColors*sizeof(PalEntry));
				}
				else
				{
					remap.Palette[0] = GPalette.BaseColors[identity[0]] & MAKEARGB(0,255,255,255);
					for (j = 1; j < ActiveColors; ++j)
					{
						remap.Palette[j] = GPalette.BaseColors[identity[j]] | MAKEARGB(255,0,0,0);
					}
				}
			}
			else
			{
				remap = Ranges[0];
			}
			Ranges.Push(remap);
			continue;
		}

		assert(parmstart->RangeStart >= 0);

		remap.Remap[0] = 0;
		remap.Palette[0] = 0;

		for (j = 1; j < ActiveColors; j++)
		{
			int v = int(luminosity[j] * 256.0);

			// Find the color range that this luminosity value lies within.
			const TranslationParm *parms = parmstart - 1;
			do
			{
				parms++;
				if (parms->RangeStart <= v && parms->RangeEnd >= v)
					break;
			}
			while (parms[1].RangeStart > parms[0].RangeEnd);

			// Linearly interpolate to find out which color this luminosity level gets.
			int rangev = ((v - parms->RangeStart) << 8) / (parms->RangeEnd - parms->RangeStart);
			int r = ((parms->Start[0] << 8) + rangev * (parms->End[0] - parms->Start[0])) >> 8; // red
			int g = ((parms->Start[1] << 8) + rangev * (parms->End[1] - parms->Start[1])) >> 8; // green
			int b = ((parms->Start[2] << 8) + rangev * (parms->End[2] - parms->Start[2])) >> 8; // blue
			r = clamp(r, 0, 255);
			g = clamp(g, 0, 255);
			b = clamp(b, 0, 255);
			remap.Remap[j] = ColorMatcher.Pick(r, g, b);
			remap.Palette[j] = PalEntry(255,r,g,b);
		}
		Ranges.Push(remap);

		// Advance to the next color range.
		while (parmstart[1].RangeStart > parmstart[0].RangeEnd)
		{
			parmstart++;
		}
		parmstart++;
	}
}